

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O3

void crnlib::LzmaEnc_InitPriceTables(UInt32 *ProbPrices)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar1 = 8;
  do {
    iVar3 = 0;
    iVar2 = 0;
    uVar5 = uVar1 & 0xffffffff;
    do {
      uVar4 = (int)uVar5 * (int)uVar5;
      iVar2 = iVar2 * 2;
      uVar6 = uVar4;
      if (0xffff < uVar4) {
        do {
          uVar6 = uVar4 >> 1;
          iVar2 = iVar2 + 1;
          bVar7 = 0x1ffff < uVar4;
          uVar4 = uVar6;
        } while (bVar7);
      }
      iVar3 = iVar3 + 1;
      uVar5 = (ulong)uVar6;
    } while (iVar3 != 4);
    ProbPrices[uVar1 >> 4] = 0xa1 - iVar2;
    bVar7 = uVar1 < 0x7f0;
    uVar1 = uVar1 + 0x10;
  } while (bVar7);
  return;
}

Assistant:

void LzmaEnc_InitPriceTables(UInt32* ProbPrices) {
  UInt32 i;
  for (i = (1 << kNumMoveReducingBits) / 2; i < kBitModelTotal; i += (1 << kNumMoveReducingBits)) {
    const int kCyclesBits = kNumBitPriceShiftBits;
    UInt32 w = i;
    UInt32 bitCount = 0;
    int j;
    for (j = 0; j < kCyclesBits; j++) {
      w = w * w;
      bitCount <<= 1;
      while (w >= ((UInt32)1 << 16)) {
        w >>= 1;
        bitCount++;
      }
    }
    ProbPrices[i >> kNumMoveReducingBits] = ((kNumBitModelTotalBits << kCyclesBits) - 15 - bitCount);
  }
}